

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrIncr.c
# Opt level: O0

int IPdr_ManSolve(Aig_Man_t *pAig,Pdr_Par_t *pPars)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  abctime aVar5;
  Vec_Vec_t *vClauses;
  Vec_Int_t *pVVar6;
  abctime aVar7;
  char *pcVar8;
  char *pcVar9;
  char *pcVar10;
  char *local_58;
  char *pFileName;
  abctime clk;
  Vec_Vec_t *vClausesSaved;
  int RetValue;
  int k;
  Pdr_Man_t *p;
  Pdr_Par_t *pPars_local;
  Aig_Man_t *pAig_local;
  
  aVar5 = Abc_Clock();
  if ((pPars->nTimeOutOne != 0) && (pPars->fSolveAll == 0)) {
    pPars->nTimeOutOne = 0;
  }
  if ((pPars->nTimeOutOne != 0) && (pPars->nTimeOut == 0)) {
    iVar3 = pPars->nTimeOutOne;
    iVar1 = Saig_ManPoNum(pAig);
    iVar4 = pPars->nTimeOutOne;
    iVar2 = Saig_ManPoNum(pAig);
    pPars->nTimeOut = (iVar3 * iVar1) / 1000 + (uint)(0 < (iVar4 * iVar2) % 1000);
  }
  if (pPars->fVerbose != 0) {
    Abc_Print(1,"VarMax = %d. FrameMax = %d. QueMax = %d. TimeMax = %d. ",
              (ulong)(uint)pPars->nRecycle,(ulong)(uint)pPars->nFrameMax,
              (ulong)(uint)pPars->nRestLimit,(ulong)(uint)pPars->nTimeOut);
    pcVar9 = "no";
    if (pPars->fMonoCnf != 0) {
      pcVar9 = "yes";
    }
    pcVar8 = "no";
    if (pPars->fSkipGeneral != 0) {
      pcVar8 = "yes";
    }
    pcVar10 = "no";
    if (pPars->fSolveAll != 0) {
      pcVar10 = "yes";
    }
    Abc_Print(1,"MonoCNF = %s. SkipGen = %s. SolveAll = %s.\n",pcVar9,pcVar8,pcVar10);
  }
  if (pAig->pSeqModel != (Abc_Cex_t *)0x0) {
    free(pAig->pSeqModel);
    pAig->pSeqModel = (Abc_Cex_t *)0x0;
  }
  _RetValue = Pdr_ManStart(pAig,pPars,(Vec_Int_t *)0x0);
  while ((iVar3 = IPdr_ManSolveInt(_RetValue,1,0), iVar3 == -1 &&
         (pPars->iFrame == pPars->nFrameMax))) {
    vClauses = IPdr_ManSaveClauses(_RetValue,1);
    Pdr_ManStop(_RetValue);
    _RetValue = Pdr_ManStart(pAig,pPars,(Vec_Int_t *)0x0);
    IPdr_ManRestoreClauses(_RetValue,vClauses,(Vec_Int_t *)0x0);
    pPars->nFrameMax = pPars->nFrameMax << 1;
  }
  if ((iVar3 == 0) &&
     ((pAig->pSeqModel == (Abc_Cex_t *)0x0 && (_RetValue->vCexes == (Vec_Ptr_t *)0x0)))) {
    __assert_fail("pAig->pSeqModel != NULL || p->vCexes != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/pdr/pdrIncr.c"
                  ,0x345,"int IPdr_ManSolve(Aig_Man_t *, Pdr_Par_t *)");
  }
  if (_RetValue->vCexes != (Vec_Ptr_t *)0x0) {
    if (_RetValue->pAig->vSeqModelVec != (Vec_Ptr_t *)0x0) {
      __assert_fail("p->pAig->vSeqModelVec == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/pdr/pdrIncr.c"
                    ,0x348,"int IPdr_ManSolve(Aig_Man_t *, Pdr_Par_t *)");
    }
    _RetValue->pAig->vSeqModelVec = _RetValue->vCexes;
    _RetValue->vCexes = (Vec_Ptr_t *)0x0;
  }
  if (_RetValue->pPars->fDumpInv == 0) {
    if (iVar3 == 1) {
      pVVar6 = Pdr_ManDeriveInfinityClauses(_RetValue,0);
      Abc_FrameSetInv(pVVar6);
    }
  }
  else {
    if (pPars->pInvFileName == (char *)0x0) {
      local_58 = Extra_FileNameGenericAppend(_RetValue->pAig->pName,"_inv.pla");
    }
    else {
      local_58 = pPars->pInvFileName;
    }
    pVVar6 = Pdr_ManDeriveInfinityClauses(_RetValue,(uint)(iVar3 != 1));
    Abc_FrameSetInv(pVVar6);
    Pdr_ManDumpClauses(_RetValue,local_58,(uint)(iVar3 == 1));
  }
  aVar7 = Abc_Clock();
  _RetValue->tTotal = (aVar7 - aVar5) + _RetValue->tTotal;
  Pdr_ManStop(_RetValue);
  pPars->iFrame = pPars->iFrame + -1;
  if (pPars->vOutMap != (Vec_Int_t *)0x0) {
    for (vClausesSaved._4_4_ = 0; iVar4 = Saig_ManPoNum(pAig), vClausesSaved._4_4_ < iVar4;
        vClausesSaved._4_4_ = vClausesSaved._4_4_ + 1) {
      iVar4 = Vec_IntEntry(pPars->vOutMap,vClausesSaved._4_4_);
      if (iVar4 == -2) {
        Vec_IntWriteEntry(pPars->vOutMap,vClausesSaved._4_4_,-1);
      }
    }
  }
  if (pPars->fUseBridge != 0) {
    Gia_ManToBridgeAbort(_stdout,7,(uchar *)"timeout");
  }
  return iVar3;
}

Assistant:

int IPdr_ManSolve( Aig_Man_t * pAig, Pdr_Par_t * pPars )
{
    Pdr_Man_t * p;
    int k, RetValue;
    Vec_Vec_t * vClausesSaved;

    abctime clk = Abc_Clock();
    if ( pPars->nTimeOutOne && !pPars->fSolveAll )
        pPars->nTimeOutOne = 0;
    if ( pPars->nTimeOutOne && pPars->nTimeOut == 0 )
        pPars->nTimeOut = pPars->nTimeOutOne * Saig_ManPoNum(pAig) / 1000 + (int)((pPars->nTimeOutOne * Saig_ManPoNum(pAig) % 1000) > 0);
    if ( pPars->fVerbose )
    {
//    Abc_Print( 1, "Running PDR by Niklas Een (aka IC3 by Aaron Bradley) with these parameters:\n" );
        Abc_Print( 1, "VarMax = %d. FrameMax = %d. QueMax = %d. TimeMax = %d. ",
            pPars->nRecycle,
            pPars->nFrameMax,
            pPars->nRestLimit,
            pPars->nTimeOut );
        Abc_Print( 1, "MonoCNF = %s. SkipGen = %s. SolveAll = %s.\n",
            pPars->fMonoCnf ?     "yes" : "no",
            pPars->fSkipGeneral ? "yes" : "no",
            pPars->fSolveAll ?    "yes" : "no" );
    }
    ABC_FREE( pAig->pSeqModel );


    p = Pdr_ManStart( pAig, pPars, NULL );
    while ( 1 ) {
        RetValue = IPdr_ManSolveInt( p, 1, 0 );

        if ( RetValue == -1 && pPars->iFrame == pPars->nFrameMax) {
            vClausesSaved = IPdr_ManSaveClauses( p, 1 );

            Pdr_ManStop( p );

            p = Pdr_ManStart( pAig, pPars, NULL );
            IPdr_ManRestoreClauses( p, vClausesSaved, NULL );

            pPars->nFrameMax = pPars->nFrameMax << 1;

            continue;
        }

        if ( RetValue == 0 )
            assert( pAig->pSeqModel != NULL || p->vCexes != NULL );
        if ( p->vCexes )
        {
            assert( p->pAig->vSeqModelVec == NULL );
            p->pAig->vSeqModelVec = p->vCexes;
            p->vCexes = NULL;
        }
        if ( p->pPars->fDumpInv )
        {
            char * pFileName = pPars->pInvFileName ? pPars->pInvFileName : Extra_FileNameGenericAppend(p->pAig->pName, "_inv.pla");
                Abc_FrameSetInv( Pdr_ManDeriveInfinityClauses( p, RetValue!=1 ) );
                Pdr_ManDumpClauses( p, pFileName, RetValue==1 );
        }
        else if ( RetValue == 1 )
            Abc_FrameSetInv( Pdr_ManDeriveInfinityClauses( p, RetValue!=1 ) );

        p->tTotal += Abc_Clock() - clk;
        Pdr_ManStop( p );

        break;
    }
    
    
    pPars->iFrame--;
    // convert all -2 (unknown) entries into -1 (undec)
    if ( pPars->vOutMap )
        for ( k = 0; k < Saig_ManPoNum(pAig); k++ )
            if ( Vec_IntEntry(pPars->vOutMap, k) == -2 ) // unknown
                Vec_IntWriteEntry( pPars->vOutMap, k, -1 ); // undec
    if ( pPars->fUseBridge )
        Gia_ManToBridgeAbort( stdout, 7, (unsigned char *)"timeout" );
    return RetValue;
}